

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O0

int MRIStepInnerStepper_Free(MRIStepInnerStepper *stepper)

{
  long *in_RDI;
  MRIStepInnerStepper in_stack_ffffffffffffffe8;
  
  if (*in_RDI != 0) {
    mriStepInnerStepper_FreeVecs(in_stack_ffffffffffffffe8);
    free((void *)*in_RDI);
    *in_RDI = 0;
  }
  return 0;
}

Assistant:

int MRIStepInnerStepper_Free(MRIStepInnerStepper *stepper)
{
  if (*stepper == NULL) return ARK_SUCCESS;

  /* free the inner forcing and fused op workspace vector */
  mriStepInnerStepper_FreeVecs(*stepper);

  /* free inner stepper mem */
  free(*stepper);
  *stepper = NULL;

  return(ARK_SUCCESS);
}